

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall Fifteen::slotReadBoard(Fifteen *this)

{
  bool bVar1;
  pointer this_00;
  QFlags<QMessageBox::StandardButton> local_f4;
  QString local_f0;
  QString local_d8;
  string local_c0;
  undefined4 local_a0;
  QFlags<QFileDialog::Option> local_9c;
  QString local_98;
  QString local_80;
  QString local_58;
  QString local_40;
  undefined1 local_28 [8];
  QString file;
  Fifteen *this_local;
  
  file.d.size = (qsizetype)this;
  QString::QString((QString *)local_28,(char *)0x0);
  QString::QString(&local_58,"");
  QDir::currentPath();
  QString::QString(&local_98);
  QFlags<QFileDialog::Option>::QFlags(&local_9c);
  QFileDialog::getOpenFileName
            ((QWidget *)&local_40,(QString *)this,(QString *)&local_58,(QString *)&local_80,
             (QString *)&local_98,(QFlags_conflict *)0x0);
  QString::operator=((QString *)local_28,&local_40);
  QString::~QString(&local_40);
  QString::~QString(&local_98);
  QString::~QString(&local_80);
  QString::~QString(&local_58);
  bVar1 = QString::isEmpty((QString *)local_28);
  if (bVar1) {
    local_a0 = 1;
  }
  else {
    this_00 = std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->
                        (&this->controller);
    QString::toStdString_abi_cxx11_(&local_c0,(QString *)local_28);
    bVar1 = Controller::readBoardFromFile(this_00,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    if (bVar1) {
      redrawTiles(this);
      local_a0 = 0;
    }
    else {
      QString::QString(&local_d8,"");
      Message::getMessages();
      QFlags<QMessageBox::StandardButton>::QFlags(&local_f4,FirstButton);
      QMessageBox::information
                ((QWidget *)this,(QString *)&local_d8,(QString *)&local_f0,
                 (QFlags_conflict *)(ulong)(uint)local_f4.i,NoButton);
      QString::~QString(&local_f0);
      QString::~QString(&local_d8);
      local_a0 = 1;
    }
  }
  QString::~QString((QString *)local_28);
  return;
}

Assistant:

void Fifteen::slotReadBoard()
{    
    QString file = nullptr;
    if ( file = QFileDialog::getOpenFileName( this, "", QDir::currentPath() );
         file.isEmpty() )
    {
        return;
    }

    if ( controller->readBoardFromFile( file.toStdString() ) == false)
    {
        QMessageBox::information( this, "", Message::getMessages() );
        return;
    }
    redrawTiles();
}